

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CheckboxFlagsT<unsigned_int>(char *label,uint *flags,uint flags_value)

{
  ImGuiItemFlags IVar1;
  ImGuiContext *pIVar2;
  ImGuiItemFlags backup_item_flags;
  ImGuiContext *g;
  bool pressed;
  bool any_on;
  bool all_on;
  uint *puStack_18;
  uint flags_value_local;
  uint *flags_local;
  char *label_local;
  
  pIVar2 = GImGui;
  g._3_1_ = (*flags & flags_value) == flags_value;
  g._2_1_ = (*flags & flags_value) != 0;
  g._4_4_ = flags_value;
  puStack_18 = flags;
  flags_local = (uint *)label;
  if (((bool)g._3_1_) || (!(bool)g._2_1_)) {
    g._1_1_ = Checkbox(label,(bool *)((long)&g + 3));
  }
  else {
    IVar1 = GImGui->CurrentItemFlags;
    GImGui->CurrentItemFlags = GImGui->CurrentItemFlags | 0x40;
    g._1_1_ = Checkbox(label,(bool *)((long)&g + 3));
    pIVar2->CurrentItemFlags = IVar1;
  }
  if (g._1_1_ != false) {
    if ((g._3_1_ & 1) == 0) {
      *puStack_18 = (g._4_4_ ^ 0xffffffff) & *puStack_18;
    }
    else {
      *puStack_18 = g._4_4_ | *puStack_18;
    }
  }
  return g._1_1_;
}

Assistant:

bool ImGui::CheckboxFlagsT(const char* label, T* flags, T flags_value)
{
    bool all_on = (*flags & flags_value) == flags_value;
    bool any_on = (*flags & flags_value) != 0;
    bool pressed;
    if (!all_on && any_on)
    {
        ImGuiContext& g = *GImGui;
        ImGuiItemFlags backup_item_flags = g.CurrentItemFlags;
        g.CurrentItemFlags |= ImGuiItemFlags_MixedValue;
        pressed = Checkbox(label, &all_on);
        g.CurrentItemFlags = backup_item_flags;
    }
    else
    {
        pressed = Checkbox(label, &all_on);

    }
    if (pressed)
    {
        if (all_on)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }
    return pressed;
}